

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O2

float Cgt_ManComputeCoverage(Aig_Man_t *pAig,Vec_Vec_t *vGates)

{
  int iVar1;
  Ssw_Sml_t *p;
  Vec_Ptr_t *vObjs;
  int i;
  int iVar2;
  
  p = Ssw_SmlSimulateSeq(pAig,0,0x20,1);
  iVar2 = 0;
  for (i = 0; i < vGates->nSize; i = i + 1) {
    vObjs = Vec_VecEntry(vGates,i);
    iVar1 = Ssw_SmlNodeCountOnesRealVec(p,vObjs);
    iVar2 = iVar2 + iVar1;
  }
  Ssw_SmlStop(p);
  return ((float)iVar2 * 100.0 * 0.03125 * 0.03125) / (float)vGates->nSize;
}

Assistant:

float Cgt_ManComputeCoverage( Aig_Man_t * pAig, Vec_Vec_t * vGates )
{
    int nFrames = 32;
    int nWords  =  1;
    Ssw_Sml_t * pSml;
    Vec_Ptr_t * vOne;
    int i, nTransSaved = 0;
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
    Vec_VecForEachLevel( vGates, vOne, i )
        nTransSaved += Ssw_SmlNodeCountOnesRealVec( pSml, vOne );
    Ssw_SmlStop( pSml );
    return (float)100.0*nTransSaved/32/nFrames/nWords/Vec_VecSize(vGates);
}